

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O3

void * embree::sse2::GeneralBVHBuilder::
       build<void*,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::rtcBuildBVHSpatialSAH(RTCBuildArguments_const*)::__5,embree::PrimRef,32ul,16ul>,embree::sse2::PrimInfoExtRange,embree::PrimRef,embree::sse2::rtcBuildBVHSpatialSAH(RTCBuildArguments_const*)::__1,embree::sse2::rtcBuildBVHSpatialSAH(RTCBuildArguments_const*)::__2,embree::sse2::rtcBuildBVHSpatialSAH(RTCBuildArguments_const*)::__3,embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<void*,embree::sse2::rtcBuildBVHSpatialSAH(RTCBuildArguments_const*)::__4>,embree::sse2::rtcBuildBVHSpatialSAH(RTCBuildArguments_const*)::__6>
                 (HeuristicArraySpatialSAH<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:317:9),_embree::PrimRef,_32UL,_16UL>
                  *heuristic,PrimRef *prims,PrimInfoExtRange *set,
                 anon_class_8_1_ba1d39f4 createAlloc,anon_class_24_3_07848ca9 createNode,
                 anon_class_16_2_60c154c9 updateNode,
                 CreateLeafExt<void_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:312:9)>
                 *createLeaf,anon_class_32_4_a8fd484c *progressMonitor,Settings *settings)

{
  CachedAllocator alloc;
  void *pvVar1;
  undefined8 *puVar2;
  Builder builder;
  DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange> local_14a;
  DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange> local_149;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  anon_class_8_1_ba1d39f4 local_130;
  BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:317:9),_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_void_*,_embree::FastAllocator::CachedAllocator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:291:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:296:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:306:9),_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<void_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:312:9)>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:322:9)>
  local_128;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  local_98;
  anon_class_16_2_60c154c9 local_28;
  
  local_28.userPtr = updateNode.userPtr;
  local_28.setNodeChildren = updateNode.setNodeChildren;
  local_128.createAlloc = &local_130;
  local_128.updateNode = &local_28;
  local_128.cfg.branchingFactor._0_4_ = (undefined4)settings->branchingFactor;
  local_128.cfg.branchingFactor._4_4_ = *(undefined4 *)((long)&settings->branchingFactor + 4);
  local_128.cfg.maxDepth._0_4_ = (undefined4)settings->maxDepth;
  local_128.cfg.maxDepth._4_4_ = *(undefined4 *)((long)&settings->maxDepth + 4);
  local_128.cfg.logBlockSize._0_4_ = (undefined4)settings->logBlockSize;
  local_128.cfg.logBlockSize._4_4_ = *(undefined4 *)((long)&settings->logBlockSize + 4);
  local_128.cfg.minLeafSize._0_4_ = (undefined4)settings->minLeafSize;
  local_128.cfg.minLeafSize._4_4_ = *(undefined4 *)((long)&settings->minLeafSize + 4);
  local_128.cfg.maxLeafSize._0_4_ = (undefined4)settings->maxLeafSize;
  local_128.cfg.maxLeafSize._4_4_ = *(undefined4 *)((long)&settings->maxLeafSize + 4);
  local_128.cfg.travCost = settings->travCost;
  local_128.cfg.intCost = settings->intCost;
  local_128.cfg.singleThreadThreshold._0_4_ = (undefined4)settings->singleThreadThreshold;
  local_128.cfg.singleThreadThreshold._4_4_ =
       *(undefined4 *)((long)&settings->singleThreadThreshold + 4);
  local_128.cfg.primrefarrayalloc._0_4_ = (undefined4)settings->primrefarrayalloc;
  local_128.cfg.primrefarrayalloc._4_4_ = *(undefined4 *)((long)&settings->primrefarrayalloc + 4);
  local_128.createNode = &createNode;
  local_128.createLeaf = createLeaf;
  local_128.canCreateLeaf = &local_149;
  local_128.canCreateLeafSplit = &local_14a;
  local_128.progressMonitor = progressMonitor;
  local_130.bvh = createAlloc.bvh;
  local_128.prims = prims;
  local_128.heuristic = heuristic;
  if (settings->branchingFactor < 0x11) {
    local_98.depth = 1;
    local_98.alloc_barrier = false;
    local_98.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._0_8_ =
         *(undefined8 *)&(set->super_CentGeomBBox3fa).geomBounds.lower.field_0;
    local_98.prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._8_8_ =
         *(undefined8 *)((long)&(set->super_CentGeomBBox3fa).geomBounds.lower.field_0 + 8);
    local_98.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._0_8_ =
         *(undefined8 *)&(set->super_CentGeomBBox3fa).geomBounds.upper.field_0;
    local_98.prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._8_8_ =
         *(undefined8 *)((long)&(set->super_CentGeomBBox3fa).geomBounds.upper.field_0 + 8);
    local_98.prims.super_CentGeomBBox3fa.centBounds.lower.field_0._0_8_ =
         *(undefined8 *)&(set->super_CentGeomBBox3fa).centBounds.lower.field_0;
    local_98.prims.super_CentGeomBBox3fa.centBounds.lower.field_0._8_8_ =
         *(undefined8 *)((long)&(set->super_CentGeomBBox3fa).centBounds.lower.field_0 + 8);
    local_98.prims.super_CentGeomBBox3fa.centBounds.upper.field_0._0_8_ =
         *(undefined8 *)&(set->super_CentGeomBBox3fa).centBounds.upper.field_0;
    local_98.prims.super_CentGeomBBox3fa.centBounds.upper.field_0._8_8_ =
         *(undefined8 *)((long)&(set->super_CentGeomBBox3fa).centBounds.upper.field_0 + 8);
    local_98.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin =
         (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
    local_98.prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end =
         (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
    local_98.prims.super_extended_range<unsigned_long>._ext_end =
         (set->super_extended_range<unsigned_long>)._ext_end;
    local_148 = 0;
    uStack_140 = 0;
    local_138 = 0;
    alloc.talloc1 = (ThreadLocal *)0x0;
    alloc.alloc = (FastAllocator *)0x0;
    alloc.talloc0 = (ThreadLocal *)0x0;
    pvVar1 = BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:317:9),_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_void_*,_embree::FastAllocator::CachedAllocator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:291:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:296:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:306:9),_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<void_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:312:9)>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:322:9)>
             ::recurse(&local_128,&local_98,alloc,true);
    return pvVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_98.depth = (size_t)&local_98.prims;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"bvh_builder: branching factor too large","");
  *puVar2 = &PTR__rtcore_error_02184a18;
  *(undefined4 *)(puVar2 + 1) = 1;
  puVar2[2] = puVar2 + 4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 2),local_98.depth,
             (long)&(((CentGeomBBox3fa *)local_98.depth)->geomBounds).lower.field_0 +
             CONCAT71(local_98._9_7_,local_98.alloc_barrier));
  __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

__noinline static ReductionTy build(Heuristic& heuristic,
                                            PrimRef* prims,
                                            const Set& set,
                                            CreateAllocFunc createAlloc,
                                            CreateNodeFunc createNode, UpdateNodeFunc updateNode,
                                            const CreateLeafFunc& createLeaf,
                                            const ProgressMonitor& progressMonitor,
                                            const Settings& settings)
      {
        typedef BuildRecordT<Set,typename Heuristic::Split> BuildRecord;

        typedef BuilderT<
          BuildRecord,
          Heuristic,
          Set,
          PrimRef,
          ReductionTy,
          decltype(createAlloc()),
          CreateAllocFunc,
          CreateNodeFunc,
          UpdateNodeFunc,
          CreateLeafFunc,
          DefaultCanCreateLeafFunc<PrimRef, Set>,
          DefaultCanCreateLeafSplitFunc<PrimRef, Set>,
          ProgressMonitor> Builder;

        /* instantiate builder */
        Builder builder(prims,
                        heuristic,
                        createAlloc,
                        createNode,
                        updateNode,
                        createLeaf,
                        DefaultCanCreateLeafFunc<PrimRef, Set>(),
                        DefaultCanCreateLeafSplitFunc<PrimRef, Set>(),
                        progressMonitor,
                        settings);

        /* build hierarchy */
        BuildRecord record(1,set);
        const ReductionTy root = builder.recurse(record,nullptr,true);
        _mm_mfence(); // to allow non-temporal stores during build
        return root;
      }